

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::CExpressionRunner>::visitBlock
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::CExpressionRunner> *this,Block *curr)

{
  Block *pBVar1;
  Expression **ppEVar2;
  char *pcVar3;
  ulong index;
  Flow local_b8;
  Block *local_70;
  ExpressionRunner<wasm::CExpressionRunner> *local_68;
  Name *local_60;
  undefined1 auStack_58 [8];
  vector<wasm::Block_*,_std::allocator<wasm::Block_*>_> stack;
  Block *local_38;
  Block *curr_local;
  
  auStack_58 = (undefined1  [8])0x0;
  stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68 = this;
  local_38 = curr;
  std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::push_back
            ((vector<wasm::Block_*,_std::allocator<wasm::Block_*>_> *)auStack_58,&local_38);
  while (((local_38->list).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements !=
          0 && (ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                          operator[](&(local_38->list).
                                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                     ,0), (*ppEVar2)->_id == BlockId))) {
    ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        (&(local_38->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,0);
    local_38 = Expression::cast<wasm::Block>(*ppEVar2);
    std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::push_back
              ((vector<wasm::Block_*,_std::allocator<wasm::Block_*>_> *)auStack_58,&local_38);
  }
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                    _M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id =
       0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.
  i64 = 0;
  (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
  local_70 = stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
             super__Vector_impl_data._M_start[-1];
  local_60 = &__return_storage_ptr__->breakTo;
  pcVar3 = (char *)0x0;
  stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)__return_storage_ptr__;
LAB_00d5bc2c:
  do {
    if ((undefined1  [8])
        stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
        super__Vector_impl_data._M_start == auStack_58) {
      std::_Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>::~_Vector_base
                ((_Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_> *)auStack_58);
      return (Flow *)stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage;
    }
    pBVar1 = stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
             super__Vector_impl_data._M_start[-1];
    stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
         super__Vector_impl_data._M_start + -1;
    local_38 = pBVar1;
    if (pcVar3 == (char *)0x0) goto LAB_00d5bc63;
  } while (pcVar3 != (pBVar1->name).super_IString.str._M_str);
LAB_00d5bc51:
  (local_60->super_IString).str._M_len = 0;
  (local_60->super_IString).str._M_str = (char *)0x0;
  goto LAB_00d5bc5b;
LAB_00d5bc63:
  for (index = 0;
      index < (pBVar1->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements; index = index + 1) {
    if ((index != 0) || (local_38 == local_70)) {
      ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pBVar1->list).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,index);
      visit(&local_b8,local_68,*ppEVar2);
      Flow::operator=(__return_storage_ptr__,&local_b8);
      SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)&local_b8);
      pcVar3 = (__return_storage_ptr__->breakTo).super_IString.str._M_str;
      if (pcVar3 != (char *)0x0) {
        if (pcVar3 == (local_38->name).super_IString.str._M_str) goto LAB_00d5bc51;
        goto LAB_00d5bc2c;
      }
    }
  }
LAB_00d5bc5b:
  pcVar3 = (char *)0x0;
  goto LAB_00d5bc2c;
}

Assistant:

Flow visitBlock(Block* curr) {
    NOTE_ENTER("Block");
    // special-case Block, because Block nesting (in their first element) can be
    // incredibly deep
    std::vector<Block*> stack;
    stack.push_back(curr);
    while (curr->list.size() > 0 && curr->list[0]->is<Block>()) {
      curr = curr->list[0]->cast<Block>();
      stack.push_back(curr);
    }
    Flow flow;
    auto* top = stack.back();
    while (stack.size() > 0) {
      curr = stack.back();
      stack.pop_back();
      if (flow.breaking()) {
        flow.clearIf(curr->name);
        continue;
      }
      auto& list = curr->list;
      for (size_t i = 0; i < list.size(); i++) {
        if (curr != top && i == 0) {
          // one of the block recursions we already handled
          continue;
        }
        flow = visit(list[i]);
        if (flow.breaking()) {
          flow.clearIf(curr->name);
          break;
        }
      }
    }
    return flow;
  }